

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.cpp
# Opt level: O1

uint __thiscall Reap::pop(Reap *this)

{
  pointer *ppuVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint *puVar2;
  iterator __position;
  pointer puVar3;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  uint unaff_EBP;
  uint other;
  uint local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  uint *local_48;
  ulong local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_40 = (ulong)this->min_bucket;
  pvVar10 = this->buckets;
  local_38 = pvVar10;
  do {
    uVar6 = local_40 & 0xffffffff;
    local_48 = pvVar10[uVar6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    puVar2 = pvVar10[uVar6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_48 == puVar2) {
      uVar8 = (int)local_40 + 1;
      local_40 = (ulong)uVar8;
      this->min_bucket = uVar8;
    }
    else {
      local_50 = pvVar10 + uVar6;
      if ((int)local_40 == 0) {
        unaff_EBP = this->last_deleted;
        ppuVar1 = &this->buckets[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + -1;
      }
      else {
        unaff_EBP = 0xffffffff;
        puVar4 = local_48;
        for (puVar7 = local_48; puVar5 = local_48, puVar7 != puVar2; puVar7 = puVar7 + 1) {
          if (*puVar7 < unaff_EBP) {
            puVar4 = puVar7;
            unaff_EBP = *puVar7;
          }
        }
        for (; puVar5 != puVar2; puVar5 = puVar5 + 1) {
          if (puVar5 != puVar4) {
            local_54 = *puVar5;
            uVar8 = local_54 ^ unaff_EBP;
            if (uVar8 == 0) {
              uVar9 = 0x20;
            }
            else {
              uVar9 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = uVar9 ^ 0x1f;
            }
            uVar9 = 0x20 - uVar9;
            this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar10 + uVar9);
            __position._M_current = *(uint **)(this_00 + 8);
            if (__position._M_current == *(uint **)(this_00 + 0x10)) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>(this_00,__position,&local_54);
              pvVar10 = local_38;
            }
            else {
              *__position._M_current = local_54;
              *(uint **)(this_00 + 8) = __position._M_current + 1;
            }
            if (uVar9 < this->min_bucket) {
              this->min_bucket = uVar9;
            }
          }
        }
        puVar3 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if ((local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish != puVar3) {
          (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish = puVar3;
        }
        if ((this->max_bucket == (uint)local_40) &&
           ((local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start ==
            (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish)) {
          this->max_bucket = (uint)local_40 - 1;
        }
      }
      if ((this->min_bucket == (uint)local_40) &&
         ((local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_finish)) {
        uVar8 = (uint)local_40 + 1;
        if (0x1f < (int)uVar8) {
          uVar8 = 0x20;
        }
        this->min_bucket = uVar8;
      }
      this->num_elements = this->num_elements - 1;
      this->last_deleted = unaff_EBP;
    }
  } while (local_48 == puVar2);
  return unaff_EBP;
}

Assistant:

unsigned Reap::pop () {
  assert (num_elements > 0);
  unsigned i = min_bucket;
  for (;;) {
    assert (i < 33);
    assert (i <= max_bucket);
    std::vector<unsigned> &s = buckets[i];
    if (s.empty ()) {
      min_bucket = ++i;
      continue;
    }
    unsigned res;
    if (i) {
      res = UINT_MAX;
      const auto begin = std::begin (s);
      const auto end = std::end (s);
      auto q = std::begin (s);
      assert (begin < end);
      for (auto p = begin; p != end; ++p) {
        const unsigned tmp = *p;
        if (tmp >= res)
          continue;
        res = tmp;
        q = p;
      }

      for (auto p = begin; p != end; ++p) {
        if (p == q)
          continue;
        const unsigned other = *p;
        const unsigned diff = other ^ res;
        assert (sizeof (unsigned) == 4);
        const unsigned j = 32 - leading_zeroes_of_unsigned (diff);
        assert (j < i);
        buckets[j].push_back (other);
        if (min_bucket > j)
          min_bucket = j;
      }

      s.clear ();

      if (i && max_bucket == i) {
#ifndef NDEBUG
        for (unsigned j = i + 1; j < 33; j++)
          assert (buckets[j].empty ());
#endif
        if (s.empty ())
          max_bucket = i - 1;
      }
    } else {
      res = last_deleted;
      assert (!buckets[0].empty ());
      assert (buckets[0].at (0) == res);
      buckets[0].pop_back ();
    }

    if (min_bucket == i) {
#ifndef NDEBUG
      for (unsigned j = 0; j < i; j++)
        assert (buckets[j].empty ());
#endif
      if (s.empty ())
        min_bucket = std::min ((int) (i + 1), 32);
    }

    --num_elements;
    assert (last_deleted <= res);
    last_deleted = res;

    return res;
  }
}